

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

bool google::SendEmailInternal(char *dest,char *subject,char *body,bool use_logging)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  size_t __n;
  ostream *poVar3;
  uint *puVar4;
  undefined8 uVar5;
  int err;
  int err_00;
  bool local_26a;
  bool local_269;
  bool local_20a;
  bool local_209;
  LogMessage local_208;
  int local_1f4;
  string local_1f0;
  string local_1d0;
  LogMessage local_1b0;
  byte local_199;
  FILE *pFStack_198;
  bool ok;
  FILE *pipe;
  LogMessage local_188;
  LogMessageVoidify local_172;
  bool local_171;
  undefined4 local_170;
  allocator<char> local_169;
  int32 verbose_level___1;
  string local_148;
  allocator<char> local_121;
  string local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  string cmd;
  LogMessage local_48;
  LogMessageVoidify local_32;
  bool local_31;
  undefined4 local_30;
  byte local_29;
  int32 verbose_level__;
  bool use_logging_local;
  char *body_local;
  char *subject_local;
  char *dest_local;
  
  if ((dest != (char *)0x0) && (*dest != '\0')) {
    local_29 = use_logging;
    _verbose_level__ = body;
    body_local = subject;
    subject_local = dest;
    if (use_logging) {
      local_30 = 1;
      local_209 = false;
      if (0 < *SendEmailInternal::vlocal__) {
        local_20a = true;
        if (SendEmailInternal::vlocal__ == &kLogSiteUninitialized) {
          local_20a = InitVLOG3__(&SendEmailInternal::vlocal__,&fLI::FLAGS_v,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                                  ,1);
        }
        local_209 = local_20a;
      }
      local_31 = local_209;
      if (local_209 != false) {
        LogMessageVoidify::LogMessageVoidify(&local_32);
        LogMessage::LogMessage
                  (&local_48,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                   ,0x722);
        poVar3 = LogMessage::stream(&local_48);
        poVar3 = std::operator<<(poVar3,"Trying to send TITLE:");
        poVar3 = std::operator<<(poVar3,body_local);
        poVar3 = std::operator<<(poVar3," BODY:");
        poVar3 = std::operator<<(poVar3,_verbose_level__);
        poVar3 = std::operator<<(poVar3," to ");
        poVar3 = std::operator<<(poVar3,subject_local);
        LogMessageVoidify::operator&(&local_32,poVar3);
        LogMessage::~LogMessage(&local_48);
      }
    }
    else {
      fprintf(_stderr,"Trying to send TITLE: %s BODY: %s to %s\n",subject,body,dest);
    }
    std::operator+(&local_e0,fLS::FLAGS_logmailer_abi_cxx11_," -s");
    pcVar2 = body_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,pcVar2,&local_121);
    ShellEscape(&local_100,&local_120);
    std::operator+(&local_c0,&local_e0,&local_100);
    std::operator+(&local_a0,&local_c0," ");
    pcVar2 = subject_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&verbose_level___1,pcVar2,&local_169);
    ShellEscape(&local_148,(string *)&verbose_level___1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   &local_a0,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&verbose_level___1);
    std::allocator<char>::~allocator(&local_169);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator(&local_121);
    std::__cxx11::string::~string((string *)&local_e0);
    local_170 = 4;
    pipe._7_1_ = 0;
    local_269 = false;
    if (3 < *SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__) {
      local_26a = true;
      if (SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__ ==
          &kLogSiteUninitialized) {
        local_26a = InitVLOG3__(&SendEmailInternal(char_const*,char_const*,char_const*,bool)::
                                 vlocal__,&fLI::FLAGS_v,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                                ,4);
      }
      local_269 = local_26a;
    }
    local_171 = local_269;
    if (local_269 != false) {
      LogMessageVoidify::LogMessageVoidify(&local_172);
      LogMessage::LogMessage
                (&local_188,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                 ,0x72c);
      pipe._7_1_ = 1;
      poVar3 = LogMessage::stream(&local_188);
      poVar3 = std::operator<<(poVar3,"Mailing command: ");
      poVar3 = std::operator<<(poVar3,(string *)local_80);
      LogMessageVoidify::operator&(&local_172,poVar3);
    }
    if ((pipe._7_1_ & 1) != 0) {
      LogMessage::~LogMessage(&local_188);
    }
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pFStack_198 = popen(pcVar2,"w");
    pcVar2 = _verbose_level__;
    if (pFStack_198 == (FILE *)0x0) {
      if ((local_29 & 1) == 0) {
        fprintf(_stderr,"Unable to send mail to %s\n",subject_local);
      }
      else {
        LogMessage::LogMessage
                  (&local_208,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                   ,0x740,2);
        poVar3 = LogMessage::stream(&local_208);
        poVar3 = std::operator<<(poVar3,"Unable to send mail to ");
        std::operator<<(poVar3,subject_local);
        LogMessage::~LogMessage(&local_208);
      }
      local_1f4 = 0;
    }
    else {
      if (_verbose_level__ != (char *)0x0) {
        __n = strlen(_verbose_level__);
        fwrite(pcVar2,1,__n,pFStack_198);
      }
      iVar1 = pclose(pFStack_198);
      pcVar2 = subject_local;
      __stream = _stderr;
      local_199 = iVar1 != -1;
      if (!(bool)local_199) {
        if ((local_29 & 1) == 0) {
          puVar4 = (uint *)__errno_location();
          StrError_abi_cxx11_(&local_1f0,(google *)(ulong)*puVar4,err_00);
          uVar5 = std::__cxx11::string::c_str();
          fprintf(__stream,"Problems sending mail to %s: %s\n",pcVar2,uVar5);
          std::__cxx11::string::~string((string *)&local_1f0);
        }
        else {
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                     ,0x736,2);
          poVar3 = LogMessage::stream(&local_1b0);
          poVar3 = std::operator<<(poVar3,"Problems sending mail to ");
          poVar3 = std::operator<<(poVar3,subject_local);
          poVar3 = std::operator<<(poVar3,": ");
          puVar4 = (uint *)__errno_location();
          StrError_abi_cxx11_(&local_1d0,(google *)(ulong)*puVar4,err);
          std::operator<<(poVar3,(string *)&local_1d0);
          std::__cxx11::string::~string((string *)&local_1d0);
          LogMessage::~LogMessage(&local_1b0);
        }
      }
      dest_local._7_1_ = local_199 & 1;
      local_1f4 = 1;
    }
    std::__cxx11::string::~string((string *)local_80);
    if (local_1f4 != 0) goto LAB_001361ec;
  }
  dest_local._7_1_ = 0;
LAB_001361ec:
  return (bool)(dest_local._7_1_ & 1);
}

Assistant:

static bool SendEmailInternal(const char*dest, const char *subject,
                              const char*body, bool use_logging) {
  if (dest && *dest) {
    if ( use_logging ) {
      VLOG(1) << "Trying to send TITLE:" << subject
              << " BODY:" << body << " to " << dest;
    } else {
      fprintf(stderr, "Trying to send TITLE: %s BODY: %s to %s\n",
              subject, body, dest);
    }

    string cmd =
        FLAGS_logmailer + " -s" +
        ShellEscape(subject) + " " + ShellEscape(dest);
    VLOG(4) << "Mailing command: " << cmd;

    FILE* pipe = popen(cmd.c_str(), "w");
    if (pipe != NULL) {
      // Add the body if we have one
      if (body)
        fwrite(body, sizeof(char), strlen(body), pipe);
      bool ok = pclose(pipe) != -1;
      if ( !ok ) {
        if ( use_logging ) {
          LOG(ERROR) << "Problems sending mail to " << dest << ": "
                     << StrError(errno);
        } else {
          fprintf(stderr, "Problems sending mail to %s: %s\n",
                  dest, StrError(errno).c_str());
        }
      }
      return ok;
    } else {
      if ( use_logging ) {
        LOG(ERROR) << "Unable to send mail to " << dest;
      } else {
        fprintf(stderr, "Unable to send mail to %s\n", dest);
      }
    }
  }
  return false;
}